

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.h
# Opt level: O0

void insertionsort<char*,bool(*)(char*const&,char*const&)>
               (char **start,char **end,_func_bool_char_ptr_ptr_char_ptr_ptr *fun)

{
  char **ppcVar1;
  ulong uVar2;
  byte local_39;
  char **local_38;
  char **j;
  char *tmp;
  char **i;
  _func_bool_char_ptr_ptr_char_ptr_ptr *fun_local;
  char **end_local;
  char **start_local;
  
  i = (char **)fun;
  fun_local = (_func_bool_char_ptr_ptr_char_ptr_ptr *)end;
  end_local = start;
  for (tmp = (char *)(start + 1); tmp < fun_local; tmp = tmp + 8) {
    uVar2 = (*(code *)i)(tmp,tmp + -8);
    if ((uVar2 & 1) != 0) {
      j = *(char ***)tmp;
      *(undefined8 *)tmp = *(undefined8 *)(tmp + -8);
      ppcVar1 = (char **)tmp;
      while( true ) {
        local_38 = ppcVar1 + -1;
        local_39 = 0;
        if (end_local < local_38) {
          local_39 = (*(code *)i)(&j,ppcVar1 + -2);
        }
        if ((local_39 & 1) == 0) break;
        *local_38 = ppcVar1[-2];
        ppcVar1 = local_38;
      }
      *local_38 = (char *)j;
    }
  }
  return;
}

Assistant:

static inline void insertionsort(T *start, T *end, F fun)
{
    for(T *i = start+1; i < end; i++)
    {
        if(fun(*i, i[-1]))
        {
            T tmp = *i;
            *i = i[-1];
            T *j = i-1;
            for(; j > start && fun(tmp, j[-1]); --j)
                *j = j[-1];
            *j = tmp;
        }
    }
    
}